

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.hpp
# Opt level: O2

void __thiscall antlr::TokenBuffer::syncConsume(TokenBuffer *this)

{
  uint uVar1;
  
  uVar1 = this->numToConsume;
  if ((ulong)uVar1 != 0) {
    if (this->nMarkers == 0) {
      CircularQueue<antlr::TokenRefCount<antlr::Token>_>::removeItems(&this->queue,(ulong)uVar1);
    }
    else {
      this->markerOffset = this->markerOffset + uVar1;
    }
    this->numToConsume = 0;
  }
  return;
}

Assistant:

inline void TokenBuffer::syncConsume()
{
	if (numToConsume > 0)
	{
		if (nMarkers > 0)
			markerOffset += numToConsume;
		else
			queue.removeItems( numToConsume );

		numToConsume = 0;
	}
}